

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

uint __thiscall QHexView::calcAddressWidth(QHexView *this)

{
  quint64 qVar1;
  qint64 qVar2;
  ulong uVar3;
  QArrayDataPointer<char16_t> QStack_28;
  
  if (this->m_hexdocument == (QHexDocument *)0x0) {
    QStack_28.size._0_4_ = 0;
  }
  else {
    qVar1 = (this->m_options).baseaddress;
    qVar2 = QHexDocument::length(this->m_hexdocument);
    uVar3 = qVar2 + qVar1;
    if (uVar3 >> 0x20 == 0) {
      QStack_28.size._0_4_ = 8;
    }
    else {
      QString::number((ulonglong)&QStack_28,(int)uVar3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
    }
  }
  return (uint)QStack_28.size;
}

Assistant:

unsigned int QHexView::calcAddressWidth() const {
    if(!m_hexdocument)
        return 0;

    auto maxaddr =
        static_cast<quint64>(m_options.baseaddress + m_hexdocument->length());
    if(maxaddr <= std::numeric_limits<quint32>::max())
        return 8;
    return QString::number(maxaddr, 16).size();
}